

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O2

int __thiscall ncnn::Tile::forward(Tile *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  size_t __n;
  size_t __n_00;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint _h;
  int iVar15;
  void *pvVar16;
  long lVar17;
  Allocator *pAVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int z;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int y;
  int iVar25;
  ulong uVar26;
  bool bVar27;
  int local_a0;
  int local_9c;
  
  iVar23 = bottom_blob->dims;
  iVar15 = (this->repeats).w;
  piVar6 = (int *)(this->repeats).data;
  local_9c = 1;
  if ((piVar6 == (int *)0x0) || ((long)(this->repeats).c * (this->repeats).cstep == 0)) {
    switch(iVar23) {
    case 1:
      iVar22 = this->tiles;
      goto LAB_0031b7a2;
    case 2:
      iVar25 = 1;
      if (this->axis == 0) {
        iVar25 = this->tiles;
      }
      iVar22 = this->tiles;
      if (this->axis != 1) {
        iVar22 = 1;
      }
      goto LAB_0031b8b7;
    case 3:
      iVar2 = this->axis;
      iVar22 = this->tiles;
      local_9c = 1;
      if (iVar2 == 0) {
        local_9c = iVar22;
      }
      iVar25 = 1;
      if (iVar2 == 1) {
        iVar25 = iVar22;
      }
      local_a0 = 1;
      if (iVar2 != 2) {
        iVar22 = 1;
      }
      break;
    case 4:
      iVar2 = this->axis;
      iVar1 = this->tiles;
      iVar22 = 1;
      local_9c = iVar22;
      if (iVar2 == 0) {
        local_9c = iVar1;
      }
      local_a0 = iVar22;
      if (iVar2 == 1) {
        local_a0 = iVar1;
      }
      iVar25 = 1;
      if (iVar2 == 2) {
        iVar25 = iVar1;
      }
      if (iVar2 == 3) {
        iVar22 = iVar1;
      }
      break;
    default:
      goto switchD_0031b779_default;
    }
  }
  else {
    switch(iVar15) {
    case 1:
      iVar22 = *piVar6;
LAB_0031b7a2:
      local_a0 = 1;
      iVar25 = 1;
      break;
    case 2:
      iVar25 = *piVar6;
      iVar22 = piVar6[1];
LAB_0031b8b7:
      local_9c = 1;
      local_a0 = 1;
      break;
    case 3:
      iVar25 = piVar6[1];
      iVar22 = piVar6[2];
      local_a0 = 1;
      local_9c = *piVar6;
      if (iVar23 == 4) {
        local_9c = 1;
        local_a0 = *piVar6;
      }
      break;
    case 4:
      iVar25 = piVar6[2];
      iVar22 = piVar6[3];
      local_a0 = piVar6[1];
      local_9c = *piVar6;
      break;
    default:
switchD_0031b779_default:
      iVar25 = 1;
      iVar22 = 1;
      local_a0 = 1;
      local_9c = 1;
    }
  }
  iVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar4 = bottom_blob->d;
  uVar5 = bottom_blob->c;
  lVar17 = (long)(int)uVar5;
  sVar7 = bottom_blob->elemsize;
  iVar1 = iVar15;
  if (iVar15 < iVar23) {
    iVar1 = iVar23;
  }
  uVar13 = uVar5;
  uVar14 = uVar4;
  if ((((iVar22 == 1) || (iVar25 != 1)) || (local_a0 != 1)) || (local_9c != 1)) {
    if (((iVar25 == 1) || (local_a0 != 1)) || (local_9c != 1)) {
      if ((local_a0 == 1) && (local_9c != 1)) {
        if (iVar1 != 4) {
          if (iVar1 != 3) goto switchD_0031b91d_default;
LAB_0031b9a7:
          pAVar18 = opt->blob_allocator;
          uVar13 = uVar5 * local_9c;
          uVar14 = uVar3 * iVar25;
          goto LAB_0031bb0d;
        }
        pAVar18 = opt->blob_allocator;
        _h = uVar3 * iVar25;
        uVar13 = uVar5 * local_9c;
      }
      else {
        if ((local_a0 == 1) || (local_9c == 1)) {
          if (iVar23 == iVar15 || iVar15 == 0) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar6 = bottom_blob->refcount;
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = top_blob->refcount;
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->c = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            piVar6 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar6;
            top_blob->elemsize = bottom_blob->elemsize;
            top_blob->elempack = bottom_blob->elempack;
            top_blob->allocator = bottom_blob->allocator;
            iVar23 = bottom_blob->w;
            iVar15 = bottom_blob->h;
            iVar2 = bottom_blob->d;
            top_blob->dims = bottom_blob->dims;
            top_blob->w = iVar23;
            top_blob->h = iVar15;
            top_blob->d = iVar2;
            top_blob->c = bottom_blob->c;
            top_blob->cstep = bottom_blob->cstep;
            return 0;
          }
          if (iVar1 != 4) {
            if (iVar1 != 3) goto LAB_0031b960;
            goto LAB_0031b9a7;
          }
        }
        else if (iVar1 != 4) goto switchD_0031b91d_default;
        pAVar18 = opt->blob_allocator;
        uVar14 = uVar4 * local_a0;
        _h = uVar3 * iVar25;
        uVar13 = uVar5 * local_9c;
      }
    }
    else {
      if (iVar1 != 4) {
        if (iVar1 == 3) {
          pAVar18 = opt->blob_allocator;
          uVar14 = uVar3 * iVar25;
          goto LAB_0031bb0d;
        }
LAB_0031b960:
        if (iVar1 != 2) goto switchD_0031b91d_default;
        pAVar18 = opt->blob_allocator;
        uVar13 = uVar3 * iVar25;
        goto LAB_0031ba79;
      }
      pAVar18 = opt->blob_allocator;
      _h = uVar3 * iVar25;
    }
LAB_0031bb6d:
    Mat::create(top_blob,iVar2 * iVar22,_h,uVar14,uVar13,sVar7,pAVar18);
  }
  else {
    switch(iVar1) {
    case 1:
      Mat::create(top_blob,iVar2 * iVar22,sVar7,opt->blob_allocator);
      break;
    case 2:
      pAVar18 = opt->blob_allocator;
      uVar13 = uVar3;
LAB_0031ba79:
      Mat::create(top_blob,iVar2 * iVar22,uVar13,sVar7,pAVar18);
      break;
    case 3:
      pAVar18 = opt->blob_allocator;
      uVar14 = uVar3;
LAB_0031bb0d:
      Mat::create(top_blob,iVar2 * iVar22,uVar14,uVar13,sVar7,pAVar18);
      break;
    case 4:
      pAVar18 = opt->blob_allocator;
      _h = uVar3;
      goto LAB_0031bb6d;
    }
  }
switchD_0031b91d_default:
  iVar23 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    __n = (long)(int)(iVar2 * iVar22 * uVar3) * 4;
    __n_00 = (long)(int)(uVar3 * uVar4 * iVar2 * iVar25 * iVar22) * 4;
    uVar19 = 0;
    if (iVar22 < 1) {
      iVar22 = 0;
    }
    uVar10 = 0;
    if (0 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    uVar11 = 0;
    if (0 < (int)uVar4) {
      uVar11 = (ulong)uVar4;
    }
    uVar12 = 0;
    if (0 < (int)uVar5) {
      uVar12 = (ulong)uVar5;
    }
    for (; uVar19 != uVar12; uVar19 = uVar19 + 1) {
      for (uVar24 = 0; uVar24 != uVar11; uVar24 = uVar24 + 1) {
        for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
          sVar7 = bottom_blob->cstep;
          sVar8 = bottom_blob->elemsize;
          pvVar9 = bottom_blob->data;
          iVar23 = bottom_blob->h;
          lVar20 = (long)bottom_blob->w * sVar8;
          pvVar16 = (void *)((((long)top_blob->h * uVar24 + uVar26) * (long)top_blob->w +
                             top_blob->cstep * uVar19) * top_blob->elemsize + (long)top_blob->data);
          iVar15 = iVar22;
          while (bVar27 = iVar15 != 0, iVar15 = iVar15 + -1, bVar27) {
            memcpy(pvVar16,(void *)((long)pvVar9 +
                                   lVar20 * uVar26 + (long)iVar23 * uVar24 * lVar20 +
                                   sVar7 * uVar19 * sVar8),(long)iVar2 * 4);
            pvVar16 = (void *)((long)pvVar16 + (long)iVar2 * 4);
          }
        }
      }
      for (uVar24 = 0; uVar24 != uVar11; uVar24 = uVar24 + 1) {
        iVar23 = top_blob->w;
        lVar20 = top_blob->cstep * uVar19;
        pvVar9 = top_blob->data;
        sVar7 = top_blob->elemsize;
        lVar21 = (long)top_blob->h * uVar24;
        pvVar16 = (void *)(((lVar21 + (int)uVar3) * (long)iVar23 + lVar20) * sVar7 + (long)pvVar9);
        for (iVar15 = 1; iVar15 < iVar25; iVar15 = iVar15 + 1) {
          memcpy(pvVar16,(void *)((long)pvVar9 + (long)iVar23 * sVar7 * lVar21 + lVar20 * sVar7),__n
                );
          pvVar16 = (void *)((long)pvVar16 + __n);
        }
      }
      lVar20 = top_blob->cstep * uVar19;
      pvVar9 = top_blob->data;
      sVar7 = top_blob->elemsize;
      pvVar16 = (void *)(((long)top_blob->w * (long)(int)uVar4 * (long)top_blob->h + lVar20) * sVar7
                        + (long)pvVar9);
      for (iVar23 = 1; iVar23 < local_a0; iVar23 = iVar23 + 1) {
        memcpy(pvVar16,(void *)(lVar20 * sVar7 + (long)pvVar9),__n_00);
        pvVar16 = (void *)((long)pvVar16 + __n_00);
      }
    }
    lVar21 = lVar17;
    for (lVar20 = 1; lVar20 < local_9c; lVar20 = lVar20 + 1) {
      memcpy((void *)(top_blob->cstep * lVar21 * top_blob->elemsize + (long)top_blob->data),
             top_blob->data,top_blob->cstep * lVar17 * 4);
      lVar21 = lVar21 + lVar17;
    }
    iVar23 = 0;
  }
  return iVar23;
}

Assistant:

int Tile::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int repeat_w = 1;
    int repeat_h = 1;
    int repeat_d = 1;
    int repeat_c = 1;

    const int repeats_num = repeats.w;

    if (repeats.empty())
    {
        if (dims == 1) // axis == 0
        {
            repeat_w = tiles;
        }
        else if (dims == 2)
        {
            if (axis == 0) repeat_h = tiles;
            if (axis == 1) repeat_w = tiles;
        }
        else if (dims == 3)
        {
            if (axis == 0) repeat_c = tiles;
            if (axis == 1) repeat_h = tiles;
            if (axis == 2) repeat_w = tiles;
        }
        else if (dims == 4)
        {
            if (axis == 0) repeat_c = tiles;
            if (axis == 1) repeat_d = tiles;
            if (axis == 2) repeat_h = tiles;
            if (axis == 3) repeat_w = tiles;
        }
    }
    else
    {
        // numpy style tile
        const int* repeats_ptr = repeats;

        if (repeats_num == 1)
        {
            repeat_w = repeats_ptr[0];
        }
        if (repeats_num == 2)
        {
            repeat_h = repeats_ptr[0];
            repeat_w = repeats_ptr[1];
        }
        if (repeats_num == 3)
        {
            if (dims == 4)
            {
                repeat_d = repeats_ptr[0];
                repeat_h = repeats_ptr[1];
                repeat_w = repeats_ptr[2];
            }
            else
            {
                repeat_c = repeats_ptr[0];
                repeat_h = repeats_ptr[1];
                repeat_w = repeats_ptr[2];
            }
        }
        if (repeats_num == 4)
        {
            repeat_c = repeats_ptr[0];
            repeat_d = repeats_ptr[1];
            repeat_h = repeats_ptr[2];
            repeat_w = repeats_ptr[3];
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int outdims = std::max(dims, repeats_num);
    if (repeat_w != 1 && repeat_h == 1 && repeat_d == 1 && repeat_c == 1)
    {
        if (outdims == 1)
            top_blob.create(w * repeat_w, elemsize, opt.blob_allocator);
        if (outdims == 2)
            top_blob.create(w * repeat_w, h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h, channels, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h, d, channels, elemsize, opt.blob_allocator);
    }
    else if (repeat_h != 1 && repeat_d == 1 && repeat_c == 1)
    {
        if (outdims == 2)
            top_blob.create(w * repeat_w, h * repeat_h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d, channels, elemsize, opt.blob_allocator);
    }
    else if (repeat_d == 1 && repeat_c != 1)
    {
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels * repeat_c, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    else if (repeat_d != 1 && repeat_c != 1)
    {
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d * repeat_d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    else // all ones
    {
        if (repeats_num == 0 || dims == repeats_num)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (outdims == 2)
            top_blob.create(w * repeat_w, h * repeat_h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels * repeat_c, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d * repeat_d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        // repeat 0-w
        for (int z = 0; z < d; z++)
        {
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.channel(q).depth(z).row(y);
                float* outptr = top_blob.channel(q).depth(z).row(y);

                for (int p = 0; p < repeat_w; p++)
                {
                    memcpy(outptr, ptr, w * sizeof(float));
                    outptr += w;
                }
            }
        }

        // repeat 1-h
        for (int z = 0; z < d; z++)
        {
            const float* ptr = top_blob.channel(q).depth(z);
            float* outptr = top_blob.channel(q).depth(z).row(h);

            const int size = w * repeat_w * h;
            for (int p = 1; p < repeat_h; p++)
            {
                memcpy(outptr, ptr, size * sizeof(float));
                outptr += size;
            }
        }

        // repeat 1-d
        {
            const float* ptr = top_blob.channel(q);
            float* outptr = top_blob.channel(q).depth(d);

            const int size = w * repeat_w * h * repeat_h * d;
            for (int p = 1; p < repeat_d; p++)
            {
                memcpy(outptr, ptr, size * sizeof(float));
                outptr += size;
            }
        }
    }

    // repeat 1-c
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 1; p < repeat_c; p++)
    {
        const float* ptr = top_blob.channel_range(0, channels);
        float* outptr = top_blob.channel_range(p * channels, channels);

        memcpy(outptr, ptr, top_blob.cstep * channels * sizeof(float));
    }

    return 0;
}